

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

int test_cmdline_callback_(int id,char *arg)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  size_t sVar3;
  char *pcVar4;
  void *pvVar5;
  test_ *ptVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  int local_44;
  
  sVar8 = test_list_size_;
  switch(id) {
  case 99:
    if ((arg == (char *)0x0) || (iVar1 = strcmp(arg,"always"), iVar1 == 0)) {
      test_colorize_ = 1;
      return 0;
    }
    iVar1 = strcmp(arg,"never");
    if (iVar1 == 0) {
      test_colorize_ = 0;
      return 0;
    }
    iVar1 = strcmp(arg,"auto");
    if (iVar1 == 0) {
      return 0;
    }
    pcVar7 = "%s: Unrecognized argument \'%s\' for option --color.\n";
    goto LAB_00104aa9;
  case 100:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x75:
    break;
  case 0x65:
    if ((arg == (char *)0x0) || (iVar1 = strcmp(arg,"always"), iVar1 == 0)) {
      test_no_exec_ = 0;
      return 0;
    }
    iVar1 = strcmp(arg,"never");
    if (iVar1 == 0) {
      test_no_exec_ = 1;
      return 0;
    }
    iVar1 = strcmp(arg,"auto");
    if (iVar1 == 0) {
      return 0;
    }
    pcVar7 = "%s: Unrecognized argument \'%s\' for option --exec.\n";
    goto LAB_00104aa9;
  case 0x68:
    test_help_();
    goto LAB_00104a5a;
  case 0x6c:
    test_list_names_();
LAB_00104a5a:
    exit(0);
  case 0x71:
    test_verbose_level_ = 0;
    break;
  case 0x73:
    test_skip_mode_ = 1;
    break;
  case 0x74:
    if ((arg == (char *)0x0) || (iVar1 = strcmp(arg,"real"), iVar1 == 0)) {
      test_timer_ = 1;
      return 0;
    }
    iVar1 = strcmp(arg,"cpu");
    if (iVar1 == 0) {
      test_timer_ = 2;
      return 0;
    }
    pcVar7 = "%s: Unrecognized argument \'%s\' for option --time.\n";
LAB_00104aa9:
    fprintf(_stderr,pcVar7,test_argv0_,arg);
LAB_00104ab3:
    pcVar7 = "Try \'%s --help\' for more information.\n";
LAB_00104ac4:
    fprintf(_stderr,pcVar7,test_argv0_);
LAB_00104acb:
    exit(2);
  case 0x76:
    if (arg == (char *)0x0) {
      test_verbose_level_ = test_verbose_level_ + 1;
    }
    else {
      test_verbose_level_ = atoi(arg);
    }
    break;
  case 0x77:
    test_worker_ = 1;
    test_worker_index_ = atoi(arg);
    break;
  case 0x78:
    test_xml_output_ = (FILE *)fopen(arg,"w");
    __stream = _stderr;
    if ((FILE *)test_xml_output_ != (FILE *)0x0) {
      return 0;
    }
    piVar2 = __errno_location();
    pcVar7 = strerror(*piVar2);
    fprintf(__stream,"Unable to open \'%s\': %s\n",arg,pcVar7);
    goto LAB_00104acb;
  default:
    if (id != 0) {
      if (id == 0x43) {
        test_colorize_ = 0;
        return 0;
      }
      if (id == 0x45) {
        test_no_exec_ = 1;
        return 0;
      }
      if (id == 0x53) {
        test_no_summary_ = 1;
        return 0;
      }
      if (id == 0x54) {
        test_tap_ = 1;
        return 0;
      }
      if (id == -0x7fffffff) {
        pcVar7 = "Unrecognized command line option \'%s\'.\n";
      }
      else if (id == -0x7ffffffe) {
        pcVar7 = "The command line option \'%s\' requires an argument.\n";
      }
      else {
        if (id != -0x7ffffffd) {
          return 0;
        }
        pcVar7 = "The command line option \'%s\' does not expect an argument.\n";
      }
      fprintf(_stderr,pcVar7,arg);
      goto LAB_00104ab3;
    }
    uVar9 = 0;
    uVar11 = 0;
    if (0 < (int)test_list_size_) {
      uVar11 = test_list_size_ & 0xffffffff;
    }
    ptVar6 = test_list_;
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      iVar1 = strcmp(ptVar6->name,arg);
      if (iVar1 == 0) {
        test_remember_((int)uVar9);
        return 0;
      }
      ptVar6 = ptVar6 + 1;
    }
    local_44 = 0;
    for (lVar10 = 0; ptVar6 = test_list_, lVar10 < (int)sVar8; lVar10 = lVar10 + 1) {
      pcVar7 = test_list_[lVar10].name;
      sVar3 = strlen(arg);
      pcVar4 = pcVar7;
      do {
        pcVar4 = strstr(pcVar4,arg);
        if (pcVar4 == (char *)0x0) goto LAB_001049a0;
        bVar13 = true;
        bVar12 = true;
        if (pcVar4 != pcVar7) {
          pvVar5 = memchr(test_name_contains_word__word_delim,(int)pcVar4[-1],10);
          bVar12 = pvVar5 != (void *)0x0;
        }
        if (pcVar4[sVar3] != '\0') {
          pvVar5 = memchr(test_name_contains_word__word_delim,(int)pcVar4[sVar3],10);
          bVar13 = pvVar5 != (void *)0x0;
        }
        pcVar4 = pcVar4 + 1;
      } while (!(bool)(bVar12 & bVar13));
      test_remember_((int)lVar10);
      local_44 = local_44 + 1;
      sVar8 = test_list_size_;
LAB_001049a0:
    }
    if (0 < local_44) {
      return 0;
    }
    for (lVar10 = 0; lVar10 < (int)sVar8; lVar10 = lVar10 + 1) {
      pcVar7 = strstr(ptVar6->name,arg);
      if (pcVar7 != (char *)0x0) {
        test_remember_((int)lVar10);
        local_44 = local_44 + 1;
        sVar8 = test_list_size_;
      }
      ptVar6 = ptVar6 + 1;
    }
    if (local_44 != 0) {
      return 0;
    }
    fprintf(_stderr,"%s: Unrecognized unit test \'%s\'\n",test_argv0_,arg);
    pcVar7 = "Try \'%s --list\' for list of unit tests.\n";
    goto LAB_00104ac4;
  }
  return 0;
}

Assistant:

static int
test_cmdline_callback_(int id, const char* arg)
{
    switch(id) {
        case 's':
            test_skip_mode_ = 1;
            break;

        case 'e':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                test_no_exec_ = 0;
            } else if(strcmp(arg, "never") == 0) {
                test_no_exec_ = 1;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --exec.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
            break;

        case 'E':
            test_no_exec_ = 1;
            break;

        case 't':
#if defined ACUTEST_WIN_  ||  defined ACUTEST_HAS_POSIX_TIMER_
            if(arg == NULL || strcmp(arg, "real") == 0) {
                test_timer_ = 1;
#ifndef ACUTEST_WIN_
            } else if(strcmp(arg, "cpu") == 0) {
                test_timer_ = 2;
#endif
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --time.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
#endif
            break;

        case 'S':
            test_no_summary_ = 1;
            break;

        case 'T':
            test_tap_ = 1;
            break;

        case 'l':
            test_list_names_();
            exit(0);

        case 'v':
            test_verbose_level_ = (arg != NULL ? atoi(arg) : test_verbose_level_+1);
            break;

        case 'q':
            test_verbose_level_ = 0;
            break;

        case 'c':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                test_colorize_ = 1;
            } else if(strcmp(arg, "never") == 0) {
                test_colorize_ = 0;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --color.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
            break;

        case 'C':
            test_colorize_ = 0;
            break;

        case 'h':
            test_help_();
            exit(0);

        case 'w':
            test_worker_ = 1;
            test_worker_index_ = atoi(arg);
            break;
        case 'x':
            test_xml_output_ = fopen(arg, "w");
            if (!test_xml_output_) {
                fprintf(stderr, "Unable to open '%s': %s\n", arg, strerror(errno));
                exit(2);
            }
            break;

        case 0:
            if(test_lookup_(arg) == 0) {
                fprintf(stderr, "%s: Unrecognized unit test '%s'\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --list' for list of unit tests.\n", test_argv0_);
                exit(2);
            }
            break;

        case TEST_CMDLINE_OPTID_UNKNOWN_:
            fprintf(stderr, "Unrecognized command line option '%s'.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);

        case TEST_CMDLINE_OPTID_MISSINGARG_:
            fprintf(stderr, "The command line option '%s' requires an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);

        case TEST_CMDLINE_OPTID_BOGUSARG_:
            fprintf(stderr, "The command line option '%s' does not expect an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);
    }

    return 0;
}